

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_memory.c
# Opt level: O0

int hash_memory(int hash,uchar *in,unsigned_long inlen,uchar *out,unsigned_long *outlen)

{
  hash_state *p;
  int local_3c;
  int err;
  hash_state *md;
  unsigned_long *outlen_local;
  uchar *out_local;
  unsigned_long inlen_local;
  uchar *in_local;
  int hash_local;
  
  if (in == (uchar *)0x0) {
    crypt_argchk("in != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x20);
  }
  if (out == (uchar *)0x0) {
    crypt_argchk("out != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x21);
  }
  if (outlen == (unsigned_long *)0x0) {
    crypt_argchk("outlen != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x22);
  }
  in_local._4_4_ = hash_is_valid(hash);
  if (in_local._4_4_ == 0) {
    if (*outlen < hash_descriptor[hash].hashsize) {
      *outlen = hash_descriptor[hash].hashsize;
      in_local._4_4_ = 6;
    }
    else {
      p = (hash_state *)LibTomMalloc(0x60);
      if (p == (hash_state *)0x0) {
        in_local._4_4_ = 0xd;
      }
      else {
        local_3c = (*hash_descriptor[hash].init)(p);
        if ((local_3c == 0) &&
           (local_3c = (*hash_descriptor[hash].process)(p,in,inlen), local_3c == 0)) {
          local_3c = (*hash_descriptor[hash].done)(p,out);
          *outlen = hash_descriptor[hash].hashsize;
        }
        LibTomFree(p);
        in_local._4_4_ = local_3c;
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int hash_memory(int hash, const unsigned char *in, unsigned long inlen, unsigned char *out, unsigned long *outlen)
{
    hash_state *md;
    int err;

    LTC_ARGCHK(in     != NULL);
    LTC_ARGCHK(out    != NULL);
    LTC_ARGCHK(outlen != NULL);

    if ((err = hash_is_valid(hash)) != CRYPT_OK) {
        return err;
    }

    if (*outlen < hash_descriptor[hash].hashsize) {
       *outlen = hash_descriptor[hash].hashsize;
       return CRYPT_BUFFER_OVERFLOW;
    }

    md = XMALLOC(sizeof(hash_state));
    if (md == NULL) {
       return CRYPT_MEM;
    }

    if ((err = hash_descriptor[hash].init(md)) != CRYPT_OK) {
       goto LBL_ERR;
    }
    if ((err = hash_descriptor[hash].process(md, in, inlen)) != CRYPT_OK) {
       goto LBL_ERR;
    }
    err = hash_descriptor[hash].done(md, out);
    *outlen = hash_descriptor[hash].hashsize;
LBL_ERR:
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
    XFREE(md);

    return err;
}